

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O3

float __thiscall
MetaCommand::GetValueAsFloat(MetaCommand *this,string *optionName,string *fieldName)

{
  pointer pcVar1;
  pointer pOVar2;
  size_t __n;
  pointer pFVar3;
  undefined1 *__s2;
  int iVar4;
  pointer pFVar5;
  pointer pOVar6;
  double dVar7;
  string fieldname;
  float local_64;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  pcVar1 = (fieldName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + fieldName->_M_string_length);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  __s2 = local_50;
  pOVar6 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar2 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_64 = 0.0;
  if (pOVar6 != pOVar2) {
    __n = optionName->_M_string_length;
    do {
      if (((pOVar6->name)._M_string_length == __n) &&
         ((__n == 0 ||
          (iVar4 = bcmp((pOVar6->name)._M_dataplus._M_p,(optionName->_M_dataplus)._M_p,__n),
          iVar4 == 0)))) {
        pFVar3 = (pOVar6->fields).
                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (pFVar5 = (pOVar6->fields).
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl.super__Vector_impl_data._M_start; pFVar5 != pFVar3;
            pFVar5 = pFVar5 + 1) {
          if (((pFVar5->name)._M_string_length == local_48) &&
             ((local_48 == 0 ||
              (iVar4 = bcmp((pFVar5->name)._M_dataplus._M_p,__s2,local_48), iVar4 == 0)))) {
            dVar7 = atof((pFVar5->value)._M_dataplus._M_p);
            local_64 = (float)dVar7;
            goto LAB_00118f02;
          }
        }
      }
      pOVar6 = pOVar6 + 1;
    } while (pOVar6 != pOVar2);
  }
LAB_00118f02:
  if (__s2 != local_40) {
    operator_delete(__s2);
  }
  return local_64;
}

Assistant:

float MetaCommand::GetValueAsFloat(METAIO_STL::string optionName,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = optionName;
  }

  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      auto itField = (*it).fields.begin();
      while(itField != (*it).fields.end())
        {
        if((*itField).name == fieldname)
          {
          return (float)atof((*itField).value.c_str());
          }
        ++itField;
        }
      }
    ++it;
    }
  return 0;
}